

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

void __thiscall
cmLocalGenerator::AppendFeatureOptions
          (cmLocalGenerator *this,string *flags,string *lang,char *feature)

{
  cmMakefile *this_00;
  cmValue cVar1;
  string *o;
  pointer pbVar2;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  string local_60;
  cmList options;
  char *feature_local;
  
  this_00 = this->Makefile;
  feature_local = feature;
  cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[18],char_const*&>
            (&local_60,(char (*) [7])0x695e73,lang,(char (*) [18])"_COMPILE_OPTIONS_",&feature_local
            );
  cVar1 = cmMakefile::GetDefinition(this_00,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  if (cVar1.Value != (string *)0x0) {
    std::__cxx11::string::string((string *)&local_60,(string *)cVar1.Value);
    init._M_len = 1;
    init._M_array = &local_60;
    cmList::cmList(&options,init);
    std::__cxx11::string::~string((string *)&local_60);
    for (pbVar2 = options.Values.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar2 != options.Values.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pbVar2 = pbVar2 + 1) {
      (*(this->super_cmOutputConverter)._vptr_cmOutputConverter[9])(this,flags,pbVar2);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&options.Values);
  }
  return;
}

Assistant:

void cmLocalGenerator::AppendFeatureOptions(std::string& flags,
                                            const std::string& lang,
                                            const char* feature)
{
  cmValue optionList = this->Makefile->GetDefinition(
    cmStrCat("CMAKE_", lang, "_COMPILE_OPTIONS_", feature));
  if (optionList) {
    cmList options{ *optionList };
    for (std::string const& o : options) {
      this->AppendFlagEscape(flags, o);
    }
  }
}